

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_8_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  long lVar65;
  long lVar66;
  long lVar67;
  short sVar68;
  undefined4 uVar69;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  short sVar78;
  undefined1 auVar79 [16];
  ushort uVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  ushort uVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  ushort uVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  ushort uVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  ushort uVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  ushort uVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  ushort uVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ushort uVar119;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  undefined1 auVar125 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  ushort uVar147;
  ushort uVar150;
  ushort uVar151;
  ushort uVar152;
  ushort uVar153;
  ushort uVar154;
  ushort uVar155;
  undefined1 auVar148 [16];
  ushort uVar156;
  undefined1 auVar149 [16];
  ushort uVar157;
  ushort uVar158;
  ushort uVar164;
  ushort uVar166;
  ushort uVar168;
  ushort uVar170;
  ushort uVar172;
  ushort uVar174;
  undefined1 auVar159 [16];
  ushort uVar176;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  ushort uVar165;
  ushort uVar167;
  ushort uVar169;
  ushort uVar171;
  ushort uVar173;
  ushort uVar175;
  ushort uVar177;
  undefined1 auVar163 [16];
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  
  auVar125 = *(undefined1 (*) [16])(s + -(long)(p * 4));
  lVar66 = (long)(p * 3);
  auVar135 = *(undefined1 (*) [16])(s + -lVar66);
  lVar67 = (long)(p * 2);
  auVar137 = *(undefined1 (*) [16])(s + -lVar67);
  lVar65 = (long)p;
  auVar138 = *(undefined1 (*) [16])(s + lVar65);
  auVar140 = *(undefined1 (*) [16])(s + -lVar65);
  auVar141 = *(undefined1 (*) [16])s;
  auVar70 = *(undefined1 (*) [16])_blimit0;
  auVar71 = *(undefined1 (*) [16])_blimit1;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar70._0_13_;
  auVar6[0xe] = auVar70[7];
  auVar12[0xc] = auVar70[6];
  auVar12._0_12_ = auVar70._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar70._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar70[5];
  auVar24._0_10_ = auVar70._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar70._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar70[4];
  auVar36._0_8_ = auVar70._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar36._8_7_;
  auVar53._1_8_ = SUB158(auVar47 << 0x40,7);
  auVar53[0] = auVar70[3];
  auVar53._9_6_ = 0;
  auVar54._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar54[0] = auVar70[2];
  auVar54._11_4_ = 0;
  auVar46._3_12_ = SUB1512(auVar54 << 0x20,3);
  auVar46[2] = auVar70[1];
  auVar46[1] = 0;
  auVar46[0] = auVar70[0];
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar71._0_13_;
  auVar1[0xe] = auVar71[7];
  auVar7[0xc] = auVar71[6];
  auVar7._0_12_ = auVar71._0_12_;
  auVar7._13_2_ = auVar1._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar71._0_11_;
  auVar13._12_3_ = auVar7._12_3_;
  auVar19[10] = auVar71[5];
  auVar19._0_10_ = auVar71._0_10_;
  auVar19._11_4_ = auVar13._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar71._0_9_;
  auVar25._10_5_ = auVar19._10_5_;
  auVar31[8] = auVar71[4];
  auVar31._0_8_ = auVar71._0_8_;
  auVar31._9_6_ = auVar25._9_6_;
  auVar48._7_8_ = 0;
  auVar48._0_7_ = auVar31._8_7_;
  auVar55._1_8_ = SUB158(auVar48 << 0x40,7);
  auVar55[0] = auVar71[3];
  auVar55._9_6_ = 0;
  auVar56._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar56[0] = auVar71[2];
  auVar56._11_4_ = 0;
  auVar37[2] = auVar71[1];
  auVar37._0_2_ = auVar71._0_2_;
  auVar37._3_12_ = SUB1512(auVar56 << 0x20,3);
  auVar41._2_13_ = auVar37._2_13_;
  auVar41._0_2_ = auVar71._0_2_ & 0xff;
  auVar71._0_8_ = auVar46._0_8_;
  auVar71._8_8_ = auVar41._0_8_;
  auVar85 = ZEXT416(bd - 8);
  auVar133 = psllw(auVar71,auVar85);
  auVar70 = *(undefined1 (*) [16])_limit0;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar70._0_13_;
  auVar2[0xe] = auVar70[7];
  auVar8[0xc] = auVar70[6];
  auVar8._0_12_ = auVar70._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar70._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = auVar70[5];
  auVar20._0_10_ = auVar70._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar70._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = auVar70[4];
  auVar32._0_8_ = auVar70._0_8_;
  auVar32._9_6_ = auVar26._9_6_;
  auVar49._7_8_ = 0;
  auVar49._0_7_ = auVar32._8_7_;
  auVar57._1_8_ = SUB158(auVar49 << 0x40,7);
  auVar57[0] = auVar70[3];
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = auVar70[2];
  auVar58._11_4_ = 0;
  auVar42._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar42[2] = auVar70[1];
  auVar42[1] = 0;
  auVar42[0] = auVar70[0];
  auVar70 = *(undefined1 (*) [16])_limit1;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar70._0_13_;
  auVar3[0xe] = auVar70[7];
  auVar9[0xc] = auVar70[6];
  auVar9._0_12_ = auVar70._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar70._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = auVar70[5];
  auVar21._0_10_ = auVar70._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar70._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = auVar70[4];
  auVar33._0_8_ = auVar70._0_8_;
  auVar33._9_6_ = auVar27._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar33._8_7_;
  auVar59._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar59[0] = auVar70[3];
  auVar59._9_6_ = 0;
  auVar60._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar60[0] = auVar70[2];
  auVar60._11_4_ = 0;
  auVar38[2] = auVar70[1];
  auVar38._0_2_ = auVar70._0_2_;
  auVar38._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar43._2_13_ = auVar38._2_13_;
  auVar43._0_2_ = auVar70._0_2_ & 0xff;
  auVar70._0_8_ = auVar42._0_8_;
  auVar70._8_8_ = auVar43._0_8_;
  auVar79 = psllw(auVar70,auVar85);
  auVar70 = *(undefined1 (*) [16])_thresh0;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar70._0_13_;
  auVar4[0xe] = auVar70[7];
  auVar10[0xc] = auVar70[6];
  auVar10._0_12_ = auVar70._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar70._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = auVar70[5];
  auVar22._0_10_ = auVar70._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar70._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = auVar70[4];
  auVar34._0_8_ = auVar70._0_8_;
  auVar34._9_6_ = auVar28._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar34._8_7_;
  auVar61._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar61[0] = auVar70[3];
  auVar61._9_6_ = 0;
  auVar62._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar62[0] = auVar70[2];
  auVar62._11_4_ = 0;
  auVar39[2] = auVar70[1];
  auVar39._0_2_ = auVar70._0_2_;
  auVar39._3_12_ = SUB1512(auVar62 << 0x20,3);
  auVar44._2_13_ = auVar39._2_13_;
  auVar44._0_2_ = auVar70._0_2_ & 0xff;
  auVar70 = *(undefined1 (*) [16])_thresh1;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar70._0_13_;
  auVar5[0xe] = auVar70[7];
  auVar11[0xc] = auVar70[6];
  auVar11._0_12_ = auVar70._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar70._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar70[5];
  auVar23._0_10_ = auVar70._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar70._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar70[4];
  auVar35._0_8_ = auVar70._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar35._8_7_;
  auVar63._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar63[0] = auVar70[3];
  auVar63._9_6_ = 0;
  auVar64._1_10_ = SUB1510(auVar63 << 0x30,5);
  auVar64[0] = auVar70[2];
  auVar64._11_4_ = 0;
  auVar40[2] = auVar70[1];
  auVar40._0_2_ = auVar70._0_2_;
  auVar40._3_12_ = SUB1512(auVar64 << 0x20,3);
  auVar45._2_13_ = auVar40._2_13_;
  auVar45._0_2_ = auVar70._0_2_ & 0xff;
  auVar143._0_8_ = auVar44._0_8_;
  auVar143._8_8_ = auVar45._0_8_;
  auVar70 = psubusw(auVar140,auVar141);
  auVar86 = psubusw(auVar141,auVar140);
  auVar71 = psubusw(auVar137,auVar138);
  auVar136 = psubusw(auVar138,auVar137);
  auVar136 = auVar136 | auVar71;
  auVar70 = paddusw(auVar86 | auVar70,auVar86 | auVar70);
  auVar134._0_2_ = auVar136._0_2_ >> 1;
  auVar134._2_2_ = auVar136._2_2_ >> 1;
  auVar134._4_2_ = auVar136._4_2_ >> 1;
  auVar134._6_2_ = auVar136._6_2_ >> 1;
  auVar134._8_2_ = auVar136._8_2_ >> 1;
  auVar134._10_2_ = auVar136._10_2_ >> 1;
  auVar134._12_2_ = auVar136._12_2_ >> 1;
  auVar134._14_2_ = auVar136._14_2_ >> 1;
  auVar70 = paddusw(auVar134,auVar70);
  auVar70 = auVar70 ^ _DAT_004df9f0;
  auVar133 = auVar133 ^ _DAT_004df9f0;
  auVar136._0_2_ = -(ushort)(auVar133._0_2_ < auVar70._0_2_);
  auVar136._2_2_ = -(ushort)(auVar133._2_2_ < auVar70._2_2_);
  auVar136._4_2_ = -(ushort)(auVar133._4_2_ < auVar70._4_2_);
  auVar136._6_2_ = -(ushort)(auVar133._6_2_ < auVar70._6_2_);
  auVar136._8_2_ = -(ushort)(auVar133._8_2_ < auVar70._8_2_);
  auVar136._10_2_ = -(ushort)(auVar133._10_2_ < auVar70._10_2_);
  auVar136._12_2_ = -(ushort)(auVar133._12_2_ < auVar70._12_2_);
  auVar136._14_2_ = -(ushort)(auVar133._14_2_ < auVar70._14_2_);
  auVar86 = paddusw(auVar79,_DAT_0051a5b0);
  auVar86 = auVar86 & auVar136;
  auVar70 = psubusw(auVar125,auVar135);
  auVar71 = psubusw(auVar135,auVar125);
  auVar71 = auVar71 | auVar70;
  auVar133 = psubusw(auVar135,auVar137);
  auVar70 = psubusw(auVar137,auVar135);
  auVar70 = auVar70 | auVar133;
  sVar68 = auVar71._0_2_;
  sVar72 = auVar70._0_2_;
  uVar80 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._2_2_;
  sVar72 = auVar70._2_2_;
  uVar89 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._4_2_;
  sVar72 = auVar70._4_2_;
  uVar94 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._6_2_;
  sVar72 = auVar70._6_2_;
  uVar99 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._8_2_;
  sVar72 = auVar70._8_2_;
  uVar104 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._10_2_;
  sVar72 = auVar70._10_2_;
  uVar109 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._12_2_;
  sVar72 = auVar70._12_2_;
  sVar73 = auVar70._14_2_;
  uVar114 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._14_2_;
  uVar119 = (ushort)(sVar73 < sVar68) * sVar68 | (ushort)(sVar73 >= sVar68) * sVar73;
  auVar70 = psubusw(auVar137,auVar140);
  auVar71 = psubusw(auVar140,auVar137);
  auVar71 = auVar71 | auVar70;
  auVar70 = psubusw(auVar138,auVar141);
  auVar133 = psubusw(auVar141,auVar138);
  auVar133 = auVar133 | auVar70;
  sVar68 = auVar71._0_2_;
  sVar72 = auVar133._0_2_;
  auVar144._0_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._2_2_;
  sVar72 = auVar133._2_2_;
  auVar144._2_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._4_2_;
  sVar72 = auVar133._4_2_;
  auVar144._4_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._6_2_;
  sVar72 = auVar133._6_2_;
  auVar144._6_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._8_2_;
  sVar72 = auVar133._8_2_;
  auVar144._8_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._10_2_;
  sVar72 = auVar133._10_2_;
  auVar144._10_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._12_2_;
  sVar72 = auVar133._12_2_;
  sVar73 = auVar133._14_2_;
  auVar144._12_2_ = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar71._14_2_;
  auVar144._14_2_ = (ushort)(sVar73 < sVar68) * sVar68 | (ushort)(sVar73 >= sVar68) * sVar73;
  auVar70 = *(undefined1 (*) [16])(s + lVar67);
  auVar71 = psubusw(auVar70,auVar138);
  auVar136 = psubusw(auVar138,auVar70);
  auVar136 = auVar136 | auVar71;
  auVar71 = *(undefined1 (*) [16])(s + lVar66);
  auVar133 = psubusw(auVar70,auVar71);
  auVar159 = psubusw(auVar71,auVar70);
  auVar159 = auVar159 | auVar133;
  sVar68 = auVar136._0_2_;
  sVar72 = auVar159._0_2_;
  uVar157 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._2_2_;
  sVar72 = auVar159._2_2_;
  uVar164 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._4_2_;
  sVar72 = auVar159._4_2_;
  uVar166 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._6_2_;
  sVar72 = auVar159._6_2_;
  uVar168 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._8_2_;
  sVar72 = auVar159._8_2_;
  uVar170 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._10_2_;
  sVar72 = auVar159._10_2_;
  uVar172 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._12_2_;
  sVar72 = auVar159._12_2_;
  sVar73 = auVar159._14_2_;
  uVar174 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar136._14_2_;
  uVar176 = (ushort)(sVar73 < sVar68) * sVar68 | (ushort)(sVar73 >= sVar68) * sVar73;
  uVar80 = ((short)uVar80 < (short)auVar144._0_2_) * auVar144._0_2_ |
           ((short)uVar80 >= (short)auVar144._0_2_) * uVar80;
  uVar89 = ((short)uVar89 < (short)auVar144._2_2_) * auVar144._2_2_ |
           ((short)uVar89 >= (short)auVar144._2_2_) * uVar89;
  uVar94 = ((short)uVar94 < (short)auVar144._4_2_) * auVar144._4_2_ |
           ((short)uVar94 >= (short)auVar144._4_2_) * uVar94;
  uVar99 = ((short)uVar99 < (short)auVar144._6_2_) * auVar144._6_2_ |
           ((short)uVar99 >= (short)auVar144._6_2_) * uVar99;
  uVar104 = ((short)uVar104 < (short)auVar144._8_2_) * auVar144._8_2_ |
            ((short)uVar104 >= (short)auVar144._8_2_) * uVar104;
  uVar109 = ((short)uVar109 < (short)auVar144._10_2_) * auVar144._10_2_ |
            ((short)uVar109 >= (short)auVar144._10_2_) * uVar109;
  uVar114 = ((short)uVar114 < (short)auVar144._12_2_) * auVar144._12_2_ |
            ((short)uVar114 >= (short)auVar144._12_2_) * uVar114;
  uVar119 = ((short)uVar119 < (short)auVar144._14_2_) * auVar144._14_2_ |
            ((short)uVar119 >= (short)auVar144._14_2_) * uVar119;
  uVar80 = ((short)uVar157 < (short)uVar80) * uVar80 | ((short)uVar157 >= (short)uVar80) * uVar157;
  uVar89 = ((short)uVar164 < (short)uVar89) * uVar89 | ((short)uVar164 >= (short)uVar89) * uVar164;
  uVar94 = ((short)uVar166 < (short)uVar94) * uVar94 | ((short)uVar166 >= (short)uVar94) * uVar166;
  uVar99 = ((short)uVar168 < (short)uVar99) * uVar99 | ((short)uVar168 >= (short)uVar99) * uVar168;
  uVar104 = ((short)uVar170 < (short)uVar104) * uVar104 |
            ((short)uVar170 >= (short)uVar104) * uVar170;
  uVar109 = ((short)uVar172 < (short)uVar109) * uVar109 |
            ((short)uVar172 >= (short)uVar109) * uVar172;
  uVar114 = ((short)uVar174 < (short)uVar114) * uVar114 |
            ((short)uVar174 >= (short)uVar114) * uVar174;
  uVar119 = ((short)uVar176 < (short)uVar119) * uVar119 |
            ((short)uVar176 >= (short)uVar119) * uVar176;
  sVar68 = auVar86._0_2_;
  auVar160._0_2_ = (ushort)((short)uVar80 < sVar68) * sVar68 | ((short)uVar80 >= sVar68) * uVar80;
  sVar68 = auVar86._2_2_;
  auVar160._2_2_ = (ushort)((short)uVar89 < sVar68) * sVar68 | ((short)uVar89 >= sVar68) * uVar89;
  sVar68 = auVar86._4_2_;
  auVar160._4_2_ = (ushort)((short)uVar94 < sVar68) * sVar68 | ((short)uVar94 >= sVar68) * uVar94;
  sVar68 = auVar86._6_2_;
  auVar160._6_2_ = (ushort)((short)uVar99 < sVar68) * sVar68 | ((short)uVar99 >= sVar68) * uVar99;
  sVar68 = auVar86._8_2_;
  auVar160._8_2_ = (ushort)((short)uVar104 < sVar68) * sVar68 | ((short)uVar104 >= sVar68) * uVar104
  ;
  sVar68 = auVar86._10_2_;
  auVar160._10_2_ =
       (ushort)((short)uVar109 < sVar68) * sVar68 | ((short)uVar109 >= sVar68) * uVar109;
  sVar68 = auVar86._12_2_;
  auVar160._12_2_ =
       (ushort)((short)uVar114 < sVar68) * sVar68 | ((short)uVar114 >= sVar68) * uVar114;
  sVar68 = auVar86._14_2_;
  auVar160._14_2_ =
       (ushort)((short)uVar119 < sVar68) * sVar68 | ((short)uVar119 >= sVar68) * uVar119;
  auVar159 = psllw(_DAT_0051a5b0,ZEXT416((uint)bd));
  auVar160 = auVar160 ^ _DAT_004df9f0;
  auVar79 = auVar79 ^ _DAT_004df9f0;
  auVar161._0_2_ = -(ushort)(auVar79._0_2_ < auVar160._0_2_);
  auVar161._2_2_ = -(ushort)(auVar79._2_2_ < auVar160._2_2_);
  auVar161._4_2_ = -(ushort)(auVar79._4_2_ < auVar160._4_2_);
  auVar161._6_2_ = -(ushort)(auVar79._6_2_ < auVar160._6_2_);
  auVar161._8_2_ = -(ushort)(auVar79._8_2_ < auVar160._8_2_);
  auVar161._10_2_ = -(ushort)(auVar79._10_2_ < auVar160._10_2_);
  auVar161._12_2_ = -(ushort)(auVar79._12_2_ < auVar160._12_2_);
  auVar161._14_2_ = -(ushort)(auVar79._14_2_ < auVar160._14_2_);
  auVar86 = psubusw(auVar135,auVar140);
  auVar79 = psubusw(auVar140,auVar135);
  auVar79 = auVar79 | auVar86;
  auVar86 = psubusw(auVar70,auVar141);
  auVar133 = psubusw(auVar141,auVar70);
  auVar133 = auVar133 | auVar86;
  sVar68 = auVar79._0_2_;
  sVar72 = auVar133._0_2_;
  uVar80 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._2_2_;
  sVar72 = auVar133._2_2_;
  uVar89 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._4_2_;
  sVar72 = auVar133._4_2_;
  uVar94 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._6_2_;
  sVar72 = auVar133._6_2_;
  uVar99 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._8_2_;
  sVar72 = auVar133._8_2_;
  uVar104 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._10_2_;
  sVar72 = auVar133._10_2_;
  uVar109 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._12_2_;
  sVar72 = auVar133._12_2_;
  sVar73 = auVar133._14_2_;
  uVar114 = (ushort)(sVar72 < sVar68) * sVar68 | (ushort)(sVar72 >= sVar68) * sVar72;
  sVar68 = auVar79._14_2_;
  uVar119 = (ushort)(sVar73 < sVar68) * sVar68 | (ushort)(sVar73 >= sVar68) * sVar73;
  auVar86 = psllw(auVar143,auVar85);
  uVar157 = ((short)uVar80 < (short)auVar144._0_2_) * auVar144._0_2_ |
            ((short)uVar80 >= (short)auVar144._0_2_) * uVar80;
  uVar164 = ((short)uVar89 < (short)auVar144._2_2_) * auVar144._2_2_ |
            ((short)uVar89 >= (short)auVar144._2_2_) * uVar89;
  uVar166 = ((short)uVar94 < (short)auVar144._4_2_) * auVar144._4_2_ |
            ((short)uVar94 >= (short)auVar144._4_2_) * uVar94;
  uVar168 = ((short)uVar99 < (short)auVar144._6_2_) * auVar144._6_2_ |
            ((short)uVar99 >= (short)auVar144._6_2_) * uVar99;
  uVar170 = ((short)uVar104 < (short)auVar144._8_2_) * auVar144._8_2_ |
            ((short)uVar104 >= (short)auVar144._8_2_) * uVar104;
  uVar172 = ((short)uVar109 < (short)auVar144._10_2_) * auVar144._10_2_ |
            ((short)uVar109 >= (short)auVar144._10_2_) * uVar109;
  uVar174 = ((short)uVar114 < (short)auVar144._12_2_) * auVar144._12_2_ |
            ((short)uVar114 >= (short)auVar144._12_2_) * uVar114;
  uVar176 = ((short)uVar119 < (short)auVar144._14_2_) * auVar144._14_2_ |
            ((short)uVar119 >= (short)auVar144._14_2_) * uVar119;
  auVar144 = auVar144 ^ _DAT_004df9f0;
  auVar86 = auVar86 ^ _DAT_004df9f0;
  auVar145._0_2_ = -(ushort)(auVar86._0_2_ < auVar144._0_2_);
  auVar145._2_2_ = -(ushort)(auVar86._2_2_ < auVar144._2_2_);
  auVar145._4_2_ = -(ushort)(auVar86._4_2_ < auVar144._4_2_);
  auVar145._6_2_ = -(ushort)(auVar86._6_2_ < auVar144._6_2_);
  auVar145._8_2_ = -(ushort)(auVar86._8_2_ < auVar144._8_2_);
  auVar145._10_2_ = -(ushort)(auVar86._10_2_ < auVar144._10_2_);
  auVar145._12_2_ = -(ushort)(auVar86._12_2_ < auVar144._12_2_);
  auVar145._14_2_ = -(ushort)(auVar86._14_2_ < auVar144._14_2_);
  auVar86 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar86 = pshuflw(auVar86,auVar86,0);
  uVar69 = auVar86._0_4_;
  auVar139._4_4_ = uVar69;
  auVar139._0_4_ = uVar69;
  auVar139._8_4_ = uVar69;
  auVar139._12_4_ = uVar69;
  auVar136 = psubsw(auVar140,auVar139);
  auVar134 = psubsw(auVar137,auVar139);
  auVar143 = psubsw(auVar141,auVar139);
  auVar148 = psubsw(auVar138,auVar139);
  auVar133._8_4_ = 0xffffffff;
  auVar133._0_8_ = 0xffffffffffffffff;
  auVar133._12_4_ = 0xffffffff;
  auVar86 = paddsw(auVar159,auVar133);
  auVar133 = psubsw(auVar86,auVar139);
  auVar79 = psubsw((undefined1  [16])0x0,auVar139);
  auVar86 = psubsw(auVar134,auVar148);
  sVar82 = auVar133._0_2_;
  sVar68 = auVar86._0_2_;
  uVar80 = (ushort)(sVar82 < sVar68) * sVar82 | (ushort)(sVar82 >= sVar68) * sVar68;
  sVar83 = auVar133._2_2_;
  sVar68 = auVar86._2_2_;
  uVar89 = (ushort)(sVar83 < sVar68) * sVar83 | (ushort)(sVar83 >= sVar68) * sVar68;
  sVar84 = auVar133._4_2_;
  sVar68 = auVar86._4_2_;
  uVar94 = (ushort)(sVar84 < sVar68) * sVar84 | (ushort)(sVar84 >= sVar68) * sVar68;
  sVar90 = auVar133._6_2_;
  sVar68 = auVar86._6_2_;
  uVar99 = (ushort)(sVar90 < sVar68) * sVar90 | (ushort)(sVar90 >= sVar68) * sVar68;
  sVar91 = auVar133._8_2_;
  sVar68 = auVar86._8_2_;
  uVar104 = (ushort)(sVar91 < sVar68) * sVar91 | (ushort)(sVar91 >= sVar68) * sVar68;
  sVar92 = auVar133._10_2_;
  sVar68 = auVar86._10_2_;
  uVar109 = (ushort)(sVar92 < sVar68) * sVar92 | (ushort)(sVar92 >= sVar68) * sVar68;
  sVar93 = auVar133._12_2_;
  sVar68 = auVar86._12_2_;
  sVar72 = auVar86._14_2_;
  uVar114 = (ushort)(sVar93 < sVar68) * sVar93 | (ushort)(sVar93 >= sVar68) * sVar68;
  sVar95 = auVar133._14_2_;
  uVar119 = (ushort)(sVar95 < sVar72) * sVar95 | (ushort)(sVar95 >= sVar72) * sVar72;
  sVar68 = auVar79._0_2_;
  auVar87._0_2_ = (ushort)((short)uVar80 < sVar68) * sVar68 | ((short)uVar80 >= sVar68) * uVar80;
  sVar73 = auVar79._2_2_;
  auVar87._2_2_ = (ushort)((short)uVar89 < sVar73) * sVar73 | ((short)uVar89 >= sVar73) * uVar89;
  sVar74 = auVar79._4_2_;
  auVar87._4_2_ = (ushort)((short)uVar94 < sVar74) * sVar74 | ((short)uVar94 >= sVar74) * uVar94;
  sVar75 = auVar79._6_2_;
  auVar87._6_2_ = (ushort)((short)uVar99 < sVar75) * sVar75 | ((short)uVar99 >= sVar75) * uVar99;
  sVar76 = auVar79._8_2_;
  auVar87._8_2_ = (ushort)((short)uVar104 < sVar76) * sVar76 | ((short)uVar104 >= sVar76) * uVar104;
  sVar77 = auVar79._10_2_;
  auVar87._10_2_ = (ushort)((short)uVar109 < sVar77) * sVar77 | ((short)uVar109 >= sVar77) * uVar109
  ;
  sVar78 = auVar79._12_2_;
  auVar87._12_2_ = (ushort)((short)uVar114 < sVar78) * sVar78 | ((short)uVar114 >= sVar78) * uVar114
  ;
  sVar81 = auVar79._14_2_;
  auVar87._14_2_ = (ushort)((short)uVar119 < sVar81) * sVar81 | ((short)uVar119 >= sVar81) * uVar119
  ;
  auVar86 = psubsw(auVar143,auVar136);
  auVar79 = paddsw(auVar87 & auVar145,auVar86);
  auVar79 = paddsw(auVar79,auVar86);
  auVar87 = paddsw(auVar79,auVar86);
  auVar79 = psubusw(auVar125,auVar140);
  auVar86 = psubusw(auVar140,auVar125);
  auVar86 = auVar86 | auVar79;
  auVar79 = psubusw(auVar71,auVar141);
  auVar133 = psubusw(auVar141,auVar71);
  auVar133 = auVar133 | auVar79;
  sVar72 = auVar86._0_2_;
  sVar96 = auVar133._0_2_;
  uVar80 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._2_2_;
  sVar96 = auVar133._2_2_;
  uVar89 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._4_2_;
  sVar96 = auVar133._4_2_;
  uVar94 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._6_2_;
  sVar96 = auVar133._6_2_;
  uVar99 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._8_2_;
  sVar96 = auVar133._8_2_;
  uVar104 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._10_2_;
  sVar96 = auVar133._10_2_;
  uVar109 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._12_2_;
  sVar96 = auVar133._12_2_;
  sVar97 = auVar133._14_2_;
  uVar114 = (ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96;
  sVar72 = auVar86._14_2_;
  uVar119 = (ushort)(sVar97 < sVar72) * sVar72 | (ushort)(sVar97 >= sVar72) * sVar97;
  auVar159._0_2_ =
       ((short)uVar80 < (short)uVar157) * uVar157 | ((short)uVar80 >= (short)uVar157) * uVar80;
  auVar159._2_2_ =
       ((short)uVar89 < (short)uVar164) * uVar164 | ((short)uVar89 >= (short)uVar164) * uVar89;
  auVar159._4_2_ =
       ((short)uVar94 < (short)uVar166) * uVar166 | ((short)uVar94 >= (short)uVar166) * uVar94;
  auVar159._6_2_ =
       ((short)uVar99 < (short)uVar168) * uVar168 | ((short)uVar99 >= (short)uVar168) * uVar99;
  auVar159._8_2_ =
       ((short)uVar104 < (short)uVar170) * uVar170 | ((short)uVar104 >= (short)uVar170) * uVar104;
  auVar159._10_2_ =
       ((short)uVar109 < (short)uVar172) * uVar172 | ((short)uVar109 >= (short)uVar172) * uVar109;
  auVar159._12_2_ =
       ((short)uVar114 < (short)uVar174) * uVar174 | ((short)uVar114 >= (short)uVar174) * uVar114;
  auVar159._14_2_ =
       ((short)uVar119 < (short)uVar176) * uVar176 | ((short)uVar119 >= (short)uVar176) * uVar119;
  auVar86 = psllw(_DAT_0051a5b0,auVar85);
  auVar159 = auVar159 ^ _DAT_004df9f0;
  auVar86 = auVar86 ^ _DAT_004df9f0;
  auVar85._0_2_ = -(ushort)(auVar86._0_2_ < auVar159._0_2_);
  auVar85._2_2_ = -(ushort)(auVar86._2_2_ < auVar159._2_2_);
  auVar85._4_2_ = -(ushort)(auVar86._4_2_ < auVar159._4_2_);
  auVar85._6_2_ = -(ushort)(auVar86._6_2_ < auVar159._6_2_);
  auVar85._8_2_ = -(ushort)(auVar86._8_2_ < auVar159._8_2_);
  auVar85._10_2_ = -(ushort)(auVar86._10_2_ < auVar159._10_2_);
  auVar85._12_2_ = -(ushort)(auVar86._12_2_ < auVar159._12_2_);
  auVar85._14_2_ = -(ushort)(auVar86._14_2_ < auVar159._14_2_);
  sVar72 = auVar87._0_2_;
  uVar80 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar87._2_2_;
  uVar89 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar87._4_2_;
  uVar94 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar87._6_2_;
  uVar99 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar87._8_2_;
  uVar104 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar87._10_2_;
  uVar109 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar87._12_2_;
  sVar96 = auVar87._14_2_;
  uVar114 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar119 = (ushort)(sVar95 < sVar96) * sVar95 | (ushort)(sVar95 >= sVar96) * sVar96;
  auVar88._0_2_ = (ushort)((short)uVar80 < sVar68) * sVar68 | ((short)uVar80 >= sVar68) * uVar80;
  auVar88._2_2_ = (ushort)((short)uVar89 < sVar73) * sVar73 | ((short)uVar89 >= sVar73) * uVar89;
  auVar88._4_2_ = (ushort)((short)uVar94 < sVar74) * sVar74 | ((short)uVar94 >= sVar74) * uVar94;
  auVar88._6_2_ = (ushort)((short)uVar99 < sVar75) * sVar75 | ((short)uVar99 >= sVar75) * uVar99;
  auVar88._8_2_ = (ushort)((short)uVar104 < sVar76) * sVar76 | ((short)uVar104 >= sVar76) * uVar104;
  auVar88._10_2_ = (ushort)((short)uVar109 < sVar77) * sVar77 | ((short)uVar109 >= sVar77) * uVar109
  ;
  auVar88._12_2_ = (ushort)((short)uVar114 < sVar78) * sVar78 | ((short)uVar114 >= sVar78) * uVar114
  ;
  auVar88._14_2_ = (ushort)((short)uVar119 < sVar81) * sVar81 | ((short)uVar119 >= sVar81) * uVar119
  ;
  auVar85 = auVar85 | auVar161;
  auVar86 = paddsw(_DAT_0050e770,~auVar161 & auVar88);
  auVar79 = paddsw(~auVar161 & auVar88,_DAT_0051a5d0);
  sVar72 = auVar79._0_2_;
  uVar80 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar79._2_2_;
  uVar89 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar79._4_2_;
  uVar94 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar79._6_2_;
  uVar99 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar79._8_2_;
  uVar104 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar79._10_2_;
  uVar109 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar79._12_2_;
  sVar96 = auVar79._14_2_;
  uVar114 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar119 = (ushort)(sVar95 < sVar96) * sVar95 | (ushort)(sVar95 >= sVar96) * sVar96;
  auVar162._0_2_ = (ushort)((short)uVar80 < sVar68) * sVar68 | ((short)uVar80 >= sVar68) * uVar80;
  auVar162._2_2_ = (ushort)((short)uVar89 < sVar73) * sVar73 | ((short)uVar89 >= sVar73) * uVar89;
  auVar162._4_2_ = (ushort)((short)uVar94 < sVar74) * sVar74 | ((short)uVar94 >= sVar74) * uVar94;
  auVar162._6_2_ = (ushort)((short)uVar99 < sVar75) * sVar75 | ((short)uVar99 >= sVar75) * uVar99;
  auVar162._8_2_ = (ushort)((short)uVar104 < sVar76) * sVar76 | ((short)uVar104 >= sVar76) * uVar104
  ;
  auVar162._10_2_ =
       (ushort)((short)uVar109 < sVar77) * sVar77 | ((short)uVar109 >= sVar77) * uVar109;
  auVar162._12_2_ =
       (ushort)((short)uVar114 < sVar78) * sVar78 | ((short)uVar114 >= sVar78) * uVar114;
  auVar162._14_2_ =
       (ushort)((short)uVar119 < sVar81) * sVar81 | ((short)uVar119 >= sVar81) * uVar119;
  auVar79 = psraw(auVar162,3);
  auVar136 = paddsw(auVar79,auVar136);
  sVar72 = auVar86._0_2_;
  uVar80 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar86._2_2_;
  uVar89 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar86._4_2_;
  uVar94 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar86._6_2_;
  uVar99 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar86._8_2_;
  uVar104 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar86._10_2_;
  uVar109 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar86._12_2_;
  sVar96 = auVar86._14_2_;
  uVar114 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar119 = (ushort)(sVar95 < sVar96) * sVar95 | (ushort)(sVar95 >= sVar96) * sVar96;
  auVar86._0_2_ = (ushort)((short)uVar80 < sVar68) * sVar68 | ((short)uVar80 >= sVar68) * uVar80;
  auVar86._2_2_ = (ushort)((short)uVar89 < sVar73) * sVar73 | ((short)uVar89 >= sVar73) * uVar89;
  auVar86._4_2_ = (ushort)((short)uVar94 < sVar74) * sVar74 | ((short)uVar94 >= sVar74) * uVar94;
  auVar86._6_2_ = (ushort)((short)uVar99 < sVar75) * sVar75 | ((short)uVar99 >= sVar75) * uVar99;
  auVar86._8_2_ = (ushort)((short)uVar104 < sVar76) * sVar76 | ((short)uVar104 >= sVar76) * uVar104;
  auVar86._10_2_ = (ushort)((short)uVar109 < sVar77) * sVar77 | ((short)uVar109 >= sVar77) * uVar109
  ;
  auVar86._12_2_ = (ushort)((short)uVar114 < sVar78) * sVar78 | ((short)uVar114 >= sVar78) * uVar114
  ;
  auVar86._14_2_ = (ushort)((short)uVar119 < sVar81) * sVar81 | ((short)uVar119 >= sVar81) * uVar119
  ;
  auVar86 = psraw(auVar86,3);
  auVar133 = psubsw(auVar143,auVar86);
  auVar79._0_2_ = auVar86._0_2_ + 1;
  auVar79._2_2_ = auVar86._2_2_ + 1;
  auVar79._4_2_ = auVar86._4_2_ + 1;
  auVar79._6_2_ = auVar86._6_2_ + 1;
  auVar79._8_2_ = auVar86._8_2_ + 1;
  auVar79._10_2_ = auVar86._10_2_ + 1;
  auVar79._12_2_ = auVar86._12_2_ + 1;
  auVar79._14_2_ = auVar86._14_2_ + 1;
  auVar86 = psraw(auVar79,1);
  auVar79 = psubsw(auVar148,~auVar145 & auVar86);
  auVar86 = paddsw(~auVar145 & auVar86,auVar134);
  sVar72 = auVar133._0_2_;
  uVar80 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar133._2_2_;
  uVar89 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar133._4_2_;
  uVar94 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar133._6_2_;
  uVar99 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar133._8_2_;
  uVar104 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar133._10_2_;
  uVar109 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar133._12_2_;
  sVar96 = auVar133._14_2_;
  uVar114 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar119 = (ushort)(sVar95 < sVar96) * sVar95 | (ushort)(sVar95 >= sVar96) * sVar96;
  sVar72 = auVar136._0_2_;
  uVar158 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar136._2_2_;
  uVar165 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar136._4_2_;
  uVar167 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar136._6_2_;
  uVar169 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar136._8_2_;
  uVar171 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar136._10_2_;
  uVar173 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar136._12_2_;
  sVar96 = auVar136._14_2_;
  uVar175 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar177 = (ushort)(sVar95 < sVar96) * sVar95 | (ushort)(sVar95 >= sVar96) * sVar96;
  sVar72 = auVar79._0_2_;
  uVar147 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar79._2_2_;
  uVar150 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar79._4_2_;
  uVar151 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar79._6_2_;
  uVar152 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar79._8_2_;
  uVar153 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar79._10_2_;
  uVar154 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar79._12_2_;
  sVar96 = auVar79._14_2_;
  uVar155 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar156 = (ushort)(sVar95 < sVar96) * sVar95 | (ushort)(sVar95 >= sVar96) * sVar96;
  sVar72 = auVar86._0_2_;
  uVar157 = (ushort)(sVar82 < sVar72) * sVar82 | (ushort)(sVar82 >= sVar72) * sVar72;
  sVar72 = auVar86._2_2_;
  uVar164 = (ushort)(sVar83 < sVar72) * sVar83 | (ushort)(sVar83 >= sVar72) * sVar72;
  sVar72 = auVar86._4_2_;
  uVar166 = (ushort)(sVar84 < sVar72) * sVar84 | (ushort)(sVar84 >= sVar72) * sVar72;
  sVar72 = auVar86._6_2_;
  uVar168 = (ushort)(sVar90 < sVar72) * sVar90 | (ushort)(sVar90 >= sVar72) * sVar72;
  sVar72 = auVar86._8_2_;
  uVar170 = (ushort)(sVar91 < sVar72) * sVar91 | (ushort)(sVar91 >= sVar72) * sVar72;
  sVar72 = auVar86._10_2_;
  uVar172 = (ushort)(sVar92 < sVar72) * sVar92 | (ushort)(sVar92 >= sVar72) * sVar72;
  sVar72 = auVar86._12_2_;
  sVar82 = auVar86._14_2_;
  uVar174 = (ushort)(sVar93 < sVar72) * sVar93 | (ushort)(sVar93 >= sVar72) * sVar72;
  uVar176 = (ushort)(sVar95 < sVar82) * sVar95 | (ushort)(sVar95 >= sVar82) * sVar82;
  auVar148._0_2_ = (ushort)((short)uVar80 < sVar68) * sVar68 | ((short)uVar80 >= sVar68) * uVar80;
  auVar148._2_2_ = (ushort)((short)uVar89 < sVar73) * sVar73 | ((short)uVar89 >= sVar73) * uVar89;
  auVar148._4_2_ = (ushort)((short)uVar94 < sVar74) * sVar74 | ((short)uVar94 >= sVar74) * uVar94;
  auVar148._6_2_ = (ushort)((short)uVar99 < sVar75) * sVar75 | ((short)uVar99 >= sVar75) * uVar99;
  auVar148._8_2_ = (ushort)((short)uVar104 < sVar76) * sVar76 | ((short)uVar104 >= sVar76) * uVar104
  ;
  auVar148._10_2_ =
       (ushort)((short)uVar109 < sVar77) * sVar77 | ((short)uVar109 >= sVar77) * uVar109;
  auVar148._12_2_ =
       (ushort)((short)uVar114 < sVar78) * sVar78 | ((short)uVar114 >= sVar78) * uVar114;
  auVar148._14_2_ =
       (ushort)((short)uVar119 < sVar81) * sVar81 | ((short)uVar119 >= sVar81) * uVar119;
  auVar163._0_2_ = (ushort)((short)uVar158 < sVar68) * sVar68 | ((short)uVar158 >= sVar68) * uVar158
  ;
  auVar163._2_2_ = (ushort)((short)uVar165 < sVar73) * sVar73 | ((short)uVar165 >= sVar73) * uVar165
  ;
  auVar163._4_2_ = (ushort)((short)uVar167 < sVar74) * sVar74 | ((short)uVar167 >= sVar74) * uVar167
  ;
  auVar163._6_2_ = (ushort)((short)uVar169 < sVar75) * sVar75 | ((short)uVar169 >= sVar75) * uVar169
  ;
  auVar163._8_2_ = (ushort)((short)uVar171 < sVar76) * sVar76 | ((short)uVar171 >= sVar76) * uVar171
  ;
  auVar163._10_2_ =
       (ushort)((short)uVar173 < sVar77) * sVar77 | ((short)uVar173 >= sVar77) * uVar173;
  auVar163._12_2_ =
       (ushort)((short)uVar175 < sVar78) * sVar78 | ((short)uVar175 >= sVar78) * uVar175;
  auVar163._14_2_ =
       (ushort)((short)uVar177 < sVar81) * sVar81 | ((short)uVar177 >= sVar81) * uVar177;
  auVar149._0_2_ = (ushort)((short)uVar147 < sVar68) * sVar68 | ((short)uVar147 >= sVar68) * uVar147
  ;
  auVar149._2_2_ = (ushort)((short)uVar150 < sVar73) * sVar73 | ((short)uVar150 >= sVar73) * uVar150
  ;
  auVar149._4_2_ = (ushort)((short)uVar151 < sVar74) * sVar74 | ((short)uVar151 >= sVar74) * uVar151
  ;
  auVar149._6_2_ = (ushort)((short)uVar152 < sVar75) * sVar75 | ((short)uVar152 >= sVar75) * uVar152
  ;
  auVar149._8_2_ = (ushort)((short)uVar153 < sVar76) * sVar76 | ((short)uVar153 >= sVar76) * uVar153
  ;
  auVar149._10_2_ =
       (ushort)((short)uVar154 < sVar77) * sVar77 | ((short)uVar154 >= sVar77) * uVar154;
  auVar149._12_2_ =
       (ushort)((short)uVar155 < sVar78) * sVar78 | ((short)uVar155 >= sVar78) * uVar155;
  auVar149._14_2_ =
       (ushort)((short)uVar156 < sVar81) * sVar81 | ((short)uVar156 >= sVar81) * uVar156;
  auVar146._0_2_ = (ushort)((short)uVar157 < sVar68) * sVar68 | ((short)uVar157 >= sVar68) * uVar157
  ;
  auVar146._2_2_ = (ushort)((short)uVar164 < sVar73) * sVar73 | ((short)uVar164 >= sVar73) * uVar164
  ;
  auVar146._4_2_ = (ushort)((short)uVar166 < sVar74) * sVar74 | ((short)uVar166 >= sVar74) * uVar166
  ;
  auVar146._6_2_ = (ushort)((short)uVar168 < sVar75) * sVar75 | ((short)uVar168 >= sVar75) * uVar168
  ;
  auVar146._8_2_ = (ushort)((short)uVar170 < sVar76) * sVar76 | ((short)uVar170 >= sVar76) * uVar170
  ;
  auVar146._10_2_ =
       (ushort)((short)uVar172 < sVar77) * sVar77 | ((short)uVar172 >= sVar77) * uVar172;
  auVar146._12_2_ =
       (ushort)((short)uVar174 < sVar78) * sVar78 | ((short)uVar174 >= sVar78) * uVar174;
  auVar146._14_2_ =
       (ushort)((short)uVar176 < sVar81) * sVar81 | ((short)uVar176 >= sVar81) * uVar176;
  auVar86 = paddsw(auVar148,auVar139);
  auVar136 = paddsw(auVar163,auVar139);
  auVar133 = paddsw(auVar149,auVar139);
  auVar79 = paddsw(auVar146,auVar139);
  if ((ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) | (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar85[0xf] >> 7) << 0xf) != 0xffff) {
    local_78 = auVar125._0_2_;
    sStack_76 = auVar125._2_2_;
    sStack_74 = auVar125._4_2_;
    sStack_72 = auVar125._6_2_;
    sStack_70 = auVar125._8_2_;
    sStack_6e = auVar125._10_2_;
    sStack_6c = auVar125._12_2_;
    sStack_6a = auVar125._14_2_;
    sVar124 = local_78 + auVar135._0_2_;
    sVar126 = sStack_76 + auVar135._2_2_;
    sVar127 = sStack_74 + auVar135._4_2_;
    sVar128 = sStack_72 + auVar135._6_2_;
    sVar129 = sStack_70 + auVar135._8_2_;
    sVar130 = sStack_6e + auVar135._10_2_;
    sVar131 = sStack_6c + auVar135._12_2_;
    sVar132 = sStack_6a + auVar135._14_2_;
    local_48 = auVar137._0_2_;
    sStack_46 = auVar137._2_2_;
    sStack_44 = auVar137._4_2_;
    sStack_42 = auVar137._6_2_;
    sStack_40 = auVar137._8_2_;
    sStack_3e = auVar137._10_2_;
    sStack_3c = auVar137._12_2_;
    sStack_3a = auVar137._14_2_;
    local_28 = auVar140._0_2_;
    sStack_26 = auVar140._2_2_;
    sStack_24 = auVar140._4_2_;
    sStack_22 = auVar140._6_2_;
    sStack_20 = auVar140._8_2_;
    sStack_1e = auVar140._10_2_;
    sStack_1c = auVar140._12_2_;
    sStack_1a = auVar140._14_2_;
    sVar81 = local_78 + local_48 + sVar124 + local_28 + 4;
    sVar90 = sStack_76 + sStack_46 + sVar126 + sStack_26 + 4;
    sVar95 = sStack_74 + sStack_44 + sVar127 + sStack_24 + 4;
    sVar100 = sStack_72 + sStack_42 + sVar128 + sStack_22 + 4;
    sVar105 = sStack_70 + sStack_40 + sVar129 + sStack_20 + 4;
    sVar110 = sStack_6e + sStack_3e + sVar130 + sStack_1e + 4;
    sVar115 = sStack_6c + sStack_3c + sVar131 + sStack_1c + 4;
    sVar120 = sStack_6a + sStack_3a + sVar132 + sStack_1a + 4;
    local_38 = auVar141._0_2_;
    sStack_36 = auVar141._2_2_;
    sStack_34 = auVar141._4_2_;
    sStack_32 = auVar141._6_2_;
    sStack_30 = auVar141._8_2_;
    sStack_2e = auVar141._10_2_;
    sStack_2c = auVar141._12_2_;
    sStack_2a = auVar141._14_2_;
    local_68 = auVar138._0_2_;
    sStack_66 = auVar138._2_2_;
    sStack_64 = auVar138._4_2_;
    sStack_62 = auVar138._6_2_;
    sStack_60 = auVar138._8_2_;
    sStack_5e = auVar138._10_2_;
    sStack_5c = auVar138._12_2_;
    sStack_5a = auVar138._14_2_;
    sVar68 = local_38 + local_68;
    sVar72 = sStack_36 + sStack_66;
    sVar73 = sStack_34 + sStack_64;
    sVar74 = sStack_32 + sStack_62;
    sVar75 = sStack_30 + sStack_60;
    sVar76 = sStack_2e + sStack_5e;
    sVar77 = sStack_2c + sStack_5c;
    sVar78 = sStack_2a + sStack_5a;
    sVar82 = (sVar81 - local_78) + auVar70._0_2_;
    sVar91 = (sVar90 - sStack_76) + auVar70._2_2_;
    sVar96 = (sVar95 - sStack_74) + auVar70._4_2_;
    sVar101 = (sVar100 - sStack_72) + auVar70._6_2_;
    sVar106 = (sVar105 - sStack_70) + auVar70._8_2_;
    sVar111 = (sVar110 - sStack_6e) + auVar70._10_2_;
    sVar116 = (sVar115 - sStack_6c) + auVar70._12_2_;
    sVar121 = (sVar120 - sStack_6a) + auVar70._14_2_;
    local_88 = auVar71._0_2_;
    sStack_86 = auVar71._2_2_;
    sStack_84 = auVar71._4_2_;
    sStack_82 = auVar71._6_2_;
    sStack_80 = auVar71._8_2_;
    sStack_7e = auVar71._10_2_;
    sStack_7c = auVar71._12_2_;
    sStack_7a = auVar71._14_2_;
    sVar83 = (sVar82 - local_78) + local_88;
    sVar92 = (sVar91 - sStack_76) + sStack_86;
    sVar97 = (sVar96 - sStack_74) + sStack_84;
    sVar102 = (sVar101 - sStack_72) + sStack_82;
    sVar107 = (sVar106 - sStack_70) + sStack_80;
    sVar112 = (sVar111 - sStack_6e) + sStack_7e;
    sVar117 = (sVar116 - sStack_6c) + sStack_7c;
    sVar122 = (sVar121 - sStack_6a) + sStack_7a;
    sVar84 = (sVar83 - auVar135._0_2_) + local_88;
    sVar93 = (sVar92 - auVar135._2_2_) + sStack_86;
    sVar98 = (sVar97 - auVar135._4_2_) + sStack_84;
    sVar103 = (sVar102 - auVar135._6_2_) + sStack_82;
    sVar108 = (sVar107 - auVar135._8_2_) + sStack_80;
    sVar113 = (sVar112 - auVar135._10_2_) + sStack_7e;
    sVar118 = (sVar117 - auVar135._12_2_) + sStack_7c;
    sVar123 = (sVar122 - auVar135._14_2_) + sStack_7a;
    auVar141._0_2_ = (ushort)(local_38 + sVar68 + sVar83) >> 3;
    auVar141._2_2_ = (ushort)(sStack_36 + sVar72 + sVar92) >> 3;
    auVar141._4_2_ = (ushort)(sStack_34 + sVar73 + sVar97) >> 3;
    auVar141._6_2_ = (ushort)(sStack_32 + sVar74 + sVar102) >> 3;
    auVar141._8_2_ = (ushort)(sStack_30 + sVar75 + sVar107) >> 3;
    auVar141._10_2_ = (ushort)(sStack_2e + sVar76 + sVar112) >> 3;
    auVar141._12_2_ = (ushort)(sStack_2c + sVar77 + sVar117) >> 3;
    auVar141._14_2_ = (ushort)(sStack_2a + sVar78 + sVar122) >> 3;
    auVar140._0_2_ = (ushort)(local_68 + sVar68 + sVar84) >> 3;
    auVar140._2_2_ = (ushort)(sStack_66 + sVar72 + sVar93) >> 3;
    auVar140._4_2_ = (ushort)(sStack_64 + sVar73 + sVar98) >> 3;
    auVar140._6_2_ = (ushort)(sStack_62 + sVar74 + sVar103) >> 3;
    auVar140._8_2_ = (ushort)(sStack_60 + sVar75 + sVar108) >> 3;
    auVar140._10_2_ = (ushort)(sStack_5e + sVar76 + sVar113) >> 3;
    auVar140._12_2_ = (ushort)(sStack_5c + sVar77 + sVar118) >> 3;
    auVar140._14_2_ = (ushort)(sStack_5a + sVar78 + sVar123) >> 3;
    auVar86 = auVar86 & auVar85 | ~auVar85 & auVar141;
    auVar137._0_2_ = (ushort)(local_28 + sVar68 + sVar82) >> 3;
    auVar137._2_2_ = (ushort)(sStack_26 + sVar72 + sVar91) >> 3;
    auVar137._4_2_ = (ushort)(sStack_24 + sVar73 + sVar96) >> 3;
    auVar137._6_2_ = (ushort)(sStack_22 + sVar74 + sVar101) >> 3;
    auVar137._8_2_ = (ushort)(sStack_20 + sVar75 + sVar106) >> 3;
    auVar137._10_2_ = (ushort)(sStack_1e + sVar76 + sVar111) >> 3;
    auVar137._12_2_ = (ushort)(sStack_1c + sVar77 + sVar116) >> 3;
    auVar137._14_2_ = (ushort)(sStack_1a + sVar78 + sVar121) >> 3;
    auVar133 = auVar133 & auVar85 | ~auVar85 & auVar140;
    auVar138._0_2_ = (ushort)(sVar68 + local_48 + sVar81) >> 3;
    auVar138._2_2_ = (ushort)(sVar72 + sStack_46 + sVar90) >> 3;
    auVar138._4_2_ = (ushort)(sVar73 + sStack_44 + sVar95) >> 3;
    auVar138._6_2_ = (ushort)(sVar74 + sStack_42 + sVar100) >> 3;
    auVar138._8_2_ = (ushort)(sVar75 + sStack_40 + sVar105) >> 3;
    auVar138._10_2_ = (ushort)(sVar76 + sStack_3e + sVar110) >> 3;
    auVar138._12_2_ = (ushort)(sVar77 + sStack_3c + sVar115) >> 3;
    auVar138._14_2_ = (ushort)(sVar78 + sStack_3a + sVar120) >> 3;
    auVar136 = auVar136 & auVar85 | ~auVar85 & auVar137;
    auVar142._0_2_ = (ushort)(((local_88 + auVar70._0_2_) - local_48) + sVar68 + sVar84) >> 3;
    auVar142._2_2_ = (ushort)(((sStack_86 + auVar70._2_2_) - sStack_46) + sVar72 + sVar93) >> 3;
    auVar142._4_2_ = (ushort)(((sStack_84 + auVar70._4_2_) - sStack_44) + sVar73 + sVar98) >> 3;
    auVar142._6_2_ = (ushort)(((sStack_82 + auVar70._6_2_) - sStack_42) + sVar74 + sVar103) >> 3;
    auVar142._8_2_ = (ushort)(((sStack_80 + auVar70._8_2_) - sStack_40) + sVar75 + sVar108) >> 3;
    auVar142._10_2_ = (ushort)(((sStack_7e + auVar70._10_2_) - sStack_3e) + sVar76 + sVar113) >> 3;
    auVar142._12_2_ = (ushort)(((sStack_7c + auVar70._12_2_) - sStack_3c) + sVar77 + sVar118) >> 3;
    auVar142._14_2_ = (ushort)(((sStack_7a + auVar70._14_2_) - sStack_3a) + sVar78 + sVar123) >> 3;
    auVar79 = auVar79 & auVar85 | ~auVar85 & auVar138;
    auVar70 = auVar70 & auVar85 | ~auVar85 & auVar142;
    auVar125._0_2_ = (ushort)(sVar124 + local_38 + sVar81) >> 3;
    auVar125._2_2_ = (ushort)(sVar126 + sStack_36 + sVar90) >> 3;
    auVar125._4_2_ = (ushort)(sVar127 + sStack_34 + sVar95) >> 3;
    auVar125._6_2_ = (ushort)(sVar128 + sStack_32 + sVar100) >> 3;
    auVar125._8_2_ = (ushort)(sVar129 + sStack_30 + sVar105) >> 3;
    auVar125._10_2_ = (ushort)(sVar130 + sStack_2e + sVar110) >> 3;
    auVar125._12_2_ = (ushort)(sVar131 + sStack_2c + sVar115) >> 3;
    auVar125._14_2_ = (ushort)(sVar132 + sStack_2a + sVar120) >> 3;
    auVar135 = auVar135 & auVar85 | ~auVar85 & auVar125;
  }
  *(undefined1 (*) [16])(s + -lVar66) = auVar135;
  *(undefined1 (*) [16])(s + -lVar67) = auVar79;
  *(undefined1 (*) [16])(s + -lVar65) = auVar136;
  *(undefined1 (*) [16])s = auVar86;
  *(undefined1 (*) [16])(s + lVar65) = auVar133;
  *(undefined1 (*) [16])(s + lVar67) = auVar70;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p3, q3;

  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s + 0 * p));

  highbd_lpf_internal_8_dual_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0,
                                  _blimit0, _limit0, _thresh0, _blimit1,
                                  _limit1, _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
  _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
  _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
  _mm_storeu_si128((__m128i *)(s + 0 * p), q0);
  _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
  _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
}